

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

t_object * __thiscall
xemmai::t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<t_pair>>
          (t_type_of<xemmai::t_object> *this,t_object *a_module,t_fields *a_fields)

{
  size_t sVar1;
  t_object *ptVar2;
  t_engine *this_00;
  size_type sVar3;
  t_type_of<t_pair> *this_01;
  t_object *ptVar4;
  undefined8 *puVar5;
  unsigned_long local_e8;
  t_type_of<xemmai::t_object> *local_e0 [3];
  t_object *local_c8;
  t_object *p;
  type *key2index;
  type *fields;
  t_fields *local_68;
  t_fields *a_fields_local;
  t_object *a_module_local;
  t_type_of<xemmai::t_object> *this_local;
  t_object *local_48;
  t_object *local_40;
  t_object *local_38;
  t_queue<256UL> *local_30;
  t_object *local_28;
  t_object *local_20;
  t_queue<128UL> *local_18;
  undefined4 local_c;
  
  local_68 = a_fields;
  a_fields_local = (t_fields *)a_module;
  a_module_local = (t_object *)this;
  xemmai::t_type_of<xemmai::t_object>::f_merge((t_fields *)&fields);
  key2index = (type *)std::
                      get<0ul,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>>
                                ((pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
                                  *)&fields);
  p = (t_object *)
      std::
      get<1ul,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>>
                ((pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
                  *)&fields);
  this_00 = f_engine();
  sVar3 = std::
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          ::size((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                  *)key2index);
  local_c8 = t_engine::f_allocate_for_type<xemmai::t_type_of<t_pair>>(this_00,sVar3);
  this_01 = (t_type_of<t_pair> *)t_object::f_data(local_c8);
  sVar1 = this->v_instance_fields;
  local_e0[0] = this;
  sVar3 = std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::size(&local_68->v_instance);
  local_e8 = sVar1 + sVar3;
  t_type_of<t_pair>::
  t_finalizes<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*,xemmai::t_object*&,unsigned_long_const&,unsigned_long,std::vector<std::pair<xemmai::t_root,xemmai::t_value<std::vector>>,std::allocator<xemmai::t_value>>&,std::map<std::array<void_const*,2ul>const&,unsigned_long,std::less<std::array<void_const*,2ul>const&>,std::allocator<unsigned_long_const&<std::array<void_const*,2ul>const&const,unsigned_long>>>&>
            (this_01,&t_bears<t_pair,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,local_e0,
             (t_object **)&a_fields_local,
             &t_derives<t_pair,_xemmai::t_type_of<xemmai::t_object>_>::c_NATIVE,&local_e8,
             (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
              *)key2index,
             (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              *)p);
  ptVar2 = local_c8;
  ptVar4 = t_object::f_of(this);
  this_local = ptVar4->v_type;
  local_48 = ptVar2;
  local_28 = t_object::f_of(this_local);
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_00133da0);
  local_18 = (t_queue<128UL> *)*puVar5;
  local_20 = local_28;
  *local_18->v_head = local_28;
  if (local_18->v_head == local_18->v_next) {
    t_slot::t_queue<128UL>::f_next(local_18);
  }
  else {
    local_18->v_head = local_18->v_head + 1;
  }
  local_c = 3;
  ptVar2->v_type = this_local;
  local_40 = ptVar2;
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_00133dd8);
  local_30 = (t_queue<256UL> *)*puVar5;
  local_38 = local_40;
  *local_30->v_head = local_40;
  if (local_30->v_head == local_30->v_next) {
    t_slot::t_queue<256UL>::f_next(local_30);
  }
  else {
    local_30->v_head = local_30->v_head + 1;
  }
  ptVar2 = local_c8;
  std::
  pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
  ::~pair((pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
           *)&fields);
  return ptVar2;
}

Assistant:

t_object* t_type::f_derive(t_object* a_module, const t_fields& a_fields)
{
	auto [fields, key2index] = f_merge(a_fields);
	auto p = f_engine()->f_allocate_for_type<T>(fields.size());
	new(p->f_data()) T(T::c_IDS, this, a_module, T::c_NATIVE, v_instance_fields + a_fields.v_instance.size(), fields, key2index);
	p->f_be(t_object::f_of(this)->v_type);
	return p;
}